

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O1

void __thiscall
wallet::CWallet::DeactivateScriptPubKeyMan(CWallet *this,uint256 id,OutputType type,bool internal)

{
  pointer pcVar1;
  WalletDatabase *pWVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> parameters_1;
  bool bVar3;
  ScriptPubKeyMan *pSVar4;
  string *psVar5;
  runtime_error *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  pointer *__ptr;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *this_01;
  long in_FS_OFFSET;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  pair<std::_Rb_tree_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::_Rb_tree_iterator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  pVar10;
  _Head_base<0UL,_wallet::DatabaseBatch_*,_false> in_stack_ffffffffffffff38;
  WalletDatabase *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined1 type_00;
  _Alloc_hider in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff58 [24];
  long *plVar11;
  long local_80 [2];
  string local_70;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pSVar4 = GetScriptPubKeyMan(this,(OutputType *)&stack0xffffffffffffff4c,internal);
  if (pSVar4 != (ScriptPubKeyMan *)0x0) {
    (*pSVar4->_vptr_ScriptPubKeyMan[0x1a])(&local_50,pSVar4);
    auVar9[0] = -((string)id.super_base_blob<256U>.m_data._M_elems[0] == local_50._0_1_);
    auVar9[1] = -(id.super_base_blob<256U>.m_data._M_elems[1] == local_50._1_1_);
    auVar9[2] = -(id.super_base_blob<256U>.m_data._M_elems[2] == local_50._2_1_);
    auVar9[3] = -(id.super_base_blob<256U>.m_data._M_elems[3] == local_50._3_1_);
    auVar9[4] = -(id.super_base_blob<256U>.m_data._M_elems[4] == local_50._4_1_);
    auVar9[5] = -(id.super_base_blob<256U>.m_data._M_elems[5] == local_50._5_1_);
    auVar9[6] = -(id.super_base_blob<256U>.m_data._M_elems[6] == local_50._6_1_);
    auVar9[7] = -(id.super_base_blob<256U>.m_data._M_elems[7] == local_50._7_1_);
    auVar9[8] = -(id.super_base_blob<256U>.m_data._M_elems[8] == (uchar)uStack_48);
    auVar9[9] = -(id.super_base_blob<256U>.m_data._M_elems[9] == uStack_48._1_1_);
    auVar9[10] = -(id.super_base_blob<256U>.m_data._M_elems[10] == uStack_48._2_1_);
    auVar9[0xb] = -(id.super_base_blob<256U>.m_data._M_elems[0xb] == uStack_48._3_1_);
    auVar9[0xc] = -(id.super_base_blob<256U>.m_data._M_elems[0xc] == uStack_48._4_1_);
    auVar9[0xd] = -(id.super_base_blob<256U>.m_data._M_elems[0xd] == uStack_48._5_1_);
    auVar9[0xe] = -(id.super_base_blob<256U>.m_data._M_elems[0xe] == uStack_48._6_1_);
    auVar9[0xf] = -(id.super_base_blob<256U>.m_data._M_elems[0xf] == uStack_48._7_1_);
    auVar8[0] = -(id.super_base_blob<256U>.m_data._M_elems[0x10] == (uchar)local_40);
    auVar8[1] = -(id.super_base_blob<256U>.m_data._M_elems[0x11] == local_40._1_1_);
    auVar8[2] = -(id.super_base_blob<256U>.m_data._M_elems[0x12] == local_40._2_1_);
    auVar8[3] = -(id.super_base_blob<256U>.m_data._M_elems[0x13] == local_40._3_1_);
    auVar8[4] = -(id.super_base_blob<256U>.m_data._M_elems[0x14] == local_40._4_1_);
    auVar8[5] = -(id.super_base_blob<256U>.m_data._M_elems[0x15] == local_40._5_1_);
    auVar8[6] = -(id.super_base_blob<256U>.m_data._M_elems[0x16] == local_40._6_1_);
    auVar8[7] = -(id.super_base_blob<256U>.m_data._M_elems[0x17] == local_40._7_1_);
    auVar8[8] = -(id.super_base_blob<256U>.m_data._M_elems[0x18] == (uchar)uStack_38);
    auVar8[9] = -(id.super_base_blob<256U>.m_data._M_elems[0x19] == uStack_38._1_1_);
    auVar8[10] = -(id.super_base_blob<256U>.m_data._M_elems[0x1a] == uStack_38._2_1_);
    auVar8[0xb] = -(id.super_base_blob<256U>.m_data._M_elems[0x1b] == uStack_38._3_1_);
    auVar8[0xc] = -(id.super_base_blob<256U>.m_data._M_elems[0x1c] == uStack_38._4_1_);
    auVar8[0xd] = -(id.super_base_blob<256U>.m_data._M_elems[0x1d] == uStack_38._5_1_);
    auVar8[0xe] = -(id.super_base_blob<256U>.m_data._M_elems[0x1e] == uStack_38._6_1_);
    auVar8[0xf] = -(id.super_base_blob<256U>.m_data._M_elems[0x1f] == uStack_38._7_1_);
    auVar8 = auVar8 & auVar9;
    if ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar8[0xf] >> 7) << 0xf) == 0xffff) {
      base_blob<256u>::ToString_abi_cxx11_(&local_70,&id);
      psVar5 = FormatOutputType_abi_cxx11_(type);
      pcVar1 = (psVar5->_M_dataplus)._M_p;
      plVar11 = local_80;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&stack0xffffffffffffff70,pcVar1,pcVar1 + psVar5->_M_string_length);
      parameters._M_string_length = (size_type)in_stack_ffffffffffffff40;
      parameters._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff38._M_head_impl;
      parameters.field_2._M_allocated_capacity._0_4_ = in_stack_ffffffffffffff48;
      parameters.field_2._M_allocated_capacity._4_4_ = type;
      parameters.field_2._8_8_ = in_stack_ffffffffffffff50._M_p;
      parameters_1.field_2._8_8_ = plVar11;
      parameters_1._0_24_ = in_stack_ffffffffffffff58;
      WalletLogPrintf<std::__cxx11::string,std::__cxx11::string,char_const*>
                (this,"Deactivate spkMan: id = %s, type = %s, internal = %s\n",parameters,
                 parameters_1,(char *)&local_70);
      type_00 = (undefined1)type;
      if (plVar11 != local_80) {
        operator_delete(plVar11,local_80[0] + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      pWVar2 = (this->m_database)._M_t.
               super___uniq_ptr_impl<wallet::WalletDatabase,_std::default_delete<wallet::WalletDatabase>_>
               ._M_t.
               super__Tuple_impl<0UL,_wallet::WalletDatabase_*,_std::default_delete<wallet::WalletDatabase>_>
               .super__Head_base<0UL,_wallet::WalletDatabase_*,_false>._M_head_impl;
      if (pWVar2 == (WalletDatabase *)0x0) {
        __assert_fail("static_cast<bool>(m_database)",
                      "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/wallet/wallet.h"
                      ,0x1be,"virtual WalletDatabase &wallet::CWallet::GetDatabase() const");
      }
      (*pWVar2->_vptr_WalletDatabase[0xe])(&stack0xffffffffffffff38,pWVar2,1);
      bVar3 = WalletBatch::EraseActiveScriptPubKeyMan
                        ((WalletBatch *)&stack0xffffffffffffff38,type_00,internal);
      if (!bVar3) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&stack0xffffffffffffff50,"DeactivateScriptPubKeyMan","");
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        &stack0xffffffffffffff50,": erasing active ScriptPubKeyMan id failed");
        local_50 = (pbVar6->_M_dataplus)._M_p;
        paVar7 = &pbVar6->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50 == paVar7) {
          local_40 = paVar7->_M_allocated_capacity;
          uStack_38 = *(undefined8 *)((long)&pbVar6->field_2 + 8);
          local_50 = (pointer)&local_40;
        }
        else {
          local_40 = paVar7->_M_allocated_capacity;
        }
        uStack_48 = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        std::runtime_error::runtime_error(this_00,(string *)&local_50);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_0016cb10;
      }
      this_01 = &this->m_external_spk_managers;
      if (internal) {
        this_01 = &this->m_internal_spk_managers;
      }
      pVar10 = std::
               _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
               ::equal_range(&this_01->_M_t,(key_type *)&stack0xffffffffffffff4c);
      std::
      _Rb_tree<OutputType,_std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>,_std::_Select1st<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
      ::_M_erase_aux(&this_01->_M_t,(_Base_ptr)pVar10.first._M_node,(_Base_ptr)pVar10.second._M_node
                    );
      if ((__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)
          in_stack_ffffffffffffff38._M_head_impl !=
          (__uniq_ptr_impl<wallet::DatabaseBatch,_std::default_delete<wallet::DatabaseBatch>_>)0x0)
      {
        (*(in_stack_ffffffffffffff38._M_head_impl)->_vptr_DatabaseBatch[5])();
      }
    }
  }
  boost::signals2::
  signal<void_(),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_()>,_boost::function<void_(const_boost::signals2::connection_&)>,_boost::signals2::mutex>
  ::operator()(&this->NotifyCanGetAddressesChanged);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
LAB_0016cb10:
  __stack_chk_fail();
}

Assistant:

void CWallet::DeactivateScriptPubKeyMan(uint256 id, OutputType type, bool internal)
{
    auto spk_man = GetScriptPubKeyMan(type, internal);
    if (spk_man != nullptr && spk_man->GetID() == id) {
        WalletLogPrintf("Deactivate spkMan: id = %s, type = %s, internal = %s\n", id.ToString(), FormatOutputType(type), internal ? "true" : "false");
        WalletBatch batch(GetDatabase());
        if (!batch.EraseActiveScriptPubKeyMan(static_cast<uint8_t>(type), internal)) {
            throw std::runtime_error(std::string(__func__) + ": erasing active ScriptPubKeyMan id failed");
        }

        auto& spk_mans = internal ? m_internal_spk_managers : m_external_spk_managers;
        spk_mans.erase(type);
    }

    NotifyCanGetAddressesChanged();
}